

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  bool local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *s_local;
  
  local_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38,(string *)s);
  bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(&local_38,(char (*) [5])0x8d7360);
  local_89 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_68,(string *)local_18);
    local_89 = cmHasLiteralSuffix<std::__cxx11::string,6ul>(&local_68,(char (*) [6])0x8d7347);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (local_89 == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
  }
  else {
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if((cmHasLiteralSuffix(s, "/bin")) ||
     (cmHasLiteralSuffix(s, "/sbin")))
    {
    return cmSystemTools::GetFilenamePath(s);
    }
  else
    {
    return s;
    }
}